

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

bool __thiscall
rlottie::internal::renderer::Stroke::updateContent
          (Stroke *this,int frameNo,VMatrix *matrix,float alpha)

{
  CapStyle CVar1;
  JoinStyle JVar2;
  bool bVar3;
  reference pfVar4;
  VDrawable *in_RDI;
  float in_XMM0_Da;
  float fVar5;
  float fVar6;
  Color CVar7;
  float *elm;
  iterator __end3;
  iterator __begin3;
  vector<float,_std::allocator<float>_> *__range3;
  float scale;
  VBrush brush;
  VColor color;
  float combinedAlpha;
  Color *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  float strokeWidth;
  char **this_00;
  float in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff5c;
  JoinStyle in_stack_ffffffffffffff5e;
  CapStyle in_stack_ffffffffffffff5f;
  VDrawable *this_01;
  undefined2 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_68;
  VMatrix *in_stack_ffffffffffffffa0;
  VBrush local_50;
  Color local_40;
  undefined8 local_30;
  float local_28;
  VColor local_24;
  float local_20;
  
  strokeWidth = (float)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  this_01 = (VDrawable *)&in_RDI[1].mName;
  local_20 = internal::model::Filter<rlottie::internal::model::Stroke>::opacity
                       ((Filter<rlottie::internal::model::Stroke> *)
                        CONCAT17(in_stack_ffffffffffffff5f,
                                 CONCAT16(in_stack_ffffffffffffff5e,
                                          CONCAT24(in_stack_ffffffffffffff5c,
                                                   in_stack_ffffffffffffff58))),(int)strokeWidth);
  local_20 = in_XMM0_Da * local_20;
  CVar7 = internal::model::Filter<rlottie::internal::model::Stroke>::color
                    ((Filter<rlottie::internal::model::Stroke> *)in_RDI,in_stack_ffffffffffffff7c);
  local_40._0_8_ = CVar7._0_8_;
  local_30._0_4_ = local_40.r;
  local_30._4_4_ = local_40.g;
  local_40.b = CVar7.b;
  local_28 = local_40.b;
  local_40 = CVar7;
  local_24 = internal::model::Color::toColor(in_stack_ffffffffffffff48,0.0);
  VBrush::VBrush(&local_50,&local_24);
  VDrawable::setBrush((VDrawable *)
                      &(in_RDI->mRasterizer).d.
                       super___shared_ptr<VRasterizer::VRasterizerImpl,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,&local_50);
  fVar5 = VMatrix::scale(in_stack_ffffffffffffffa0);
  CVar1 = internal::model::Filter<rlottie::internal::model::Stroke>::capStyle
                    ((Filter<rlottie::internal::model::Stroke> *)0x1641e8);
  JVar2 = internal::model::Filter<rlottie::internal::model::Stroke>::joinStyle
                    ((Filter<rlottie::internal::model::Stroke> *)0x1641fa);
  fVar6 = internal::model::Filter<rlottie::internal::model::Stroke>::miterLimit
                    ((Filter<rlottie::internal::model::Stroke> *)0x16420c);
  internal::model::Filter<rlottie::internal::model::Stroke>::strokeWidth
            ((Filter<rlottie::internal::model::Stroke> *)
             CONCAT17(in_stack_ffffffffffffff5f,
                      CONCAT16(in_stack_ffffffffffffff5e,
                               CONCAT24(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))),
             (int)strokeWidth);
  VDrawable::setStrokeInfo
            (this_01,in_stack_ffffffffffffff5f,in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58,
             strokeWidth);
  bVar3 = internal::model::Filter<rlottie::internal::model::Stroke>::hasDashInfo
                    ((Filter<rlottie::internal::model::Stroke> *)0x16425c);
  if (bVar3) {
    _ZTWL11Dash_Vector();
    std::vector<float,_std::allocator<float>_>::clear
              ((vector<float,_std::allocator<float>_> *)0x164272);
    this_00 = &in_RDI[1].mName;
    _ZTWL11Dash_Vector();
    internal::model::Filter<rlottie::internal::model::Stroke>::getDashInfo
              ((Filter<rlottie::internal::model::Stroke> *)this_00,
               (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
               (vector<float,_std::allocator<float>_> *)0x1642a1);
    _ZTWL11Dash_Vector();
    bVar3 = std::vector<float,_std::allocator<float>_>::empty
                      ((vector<float,_std::allocator<float>_> *)this_01);
    if (!bVar3) {
      _ZTWL11Dash_Vector();
      local_68._M_current =
           (float *)std::vector<float,_std::allocator<float>_>::begin
                              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff48);
      std::vector<float,_std::allocator<float>_>::end
                ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff48);
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                 *)this_00,
                                (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                 *)in_stack_ffffffffffffff48), bVar3) {
        pfVar4 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                 ::operator*(&local_68);
        *pfVar4 = fVar5 * *pfVar4;
        __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
        operator++(&local_68);
      }
      _ZTWL11Dash_Vector();
      VDrawable::setDashInfo
                (in_RDI,(vector<float,_std::allocator<float>_> *)
                        CONCAT44(fVar6,CONCAT13(JVar2,CONCAT12(CVar1,in_stack_ffffffffffffff78))));
    }
  }
  bVar3 = VColor::isTransparent(&local_24);
  return (bool)((bVar3 ^ 0xffU) & 1);
}

Assistant:

bool renderer::Stroke::updateContent(int frameNo, const VMatrix &matrix,
                                     float alpha)
{
    auto combinedAlpha = alpha * mModel.opacity(frameNo);
    auto color = mModel.color(frameNo).toColor(combinedAlpha);

    VBrush brush(color);
    mDrawable.setBrush(brush);
    float scale = matrix.scale();
    mDrawable.setStrokeInfo(mModel.capStyle(), mModel.joinStyle(),
                            mModel.miterLimit(),
                            mModel.strokeWidth(frameNo) * scale);

    if (mModel.hasDashInfo()) {
        Dash_Vector.clear();
        mModel.getDashInfo(frameNo, Dash_Vector);
        if (!Dash_Vector.empty()) {
            for (auto &elm : Dash_Vector) elm *= scale;
            mDrawable.setDashInfo(Dash_Vector);
        }
    }

    return !color.isTransparent();
}